

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_local_scale(REF_DBL *metric,REF_GRID ref_grid,REF_INT p_norm)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL exponent;
  REF_DBL det;
  int local_38;
  REF_INT dimension;
  REF_INT node;
  REF_INT i;
  REF_NODE ref_node;
  REF_GRID pRStack_20;
  REF_INT p_norm_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  _node = ref_grid->node;
  det._4_4_ = 3;
  if (ref_grid->twod != 0) {
    det._4_4_ = 2;
  }
  if (ref_grid->twod != 0) {
    for (local_38 = 0; local_38 < _node->max; local_38 = local_38 + 1) {
      if (((-1 < local_38) && (local_38 < _node->max)) && (-1 < _node->global[local_38])) {
        metric[local_38 * 6 + 2] = 0.0;
        metric[local_38 * 6 + 4] = 0.0;
        metric[local_38 * 6 + 5] = 1.0;
      }
    }
  }
  iVar1 = p_norm * 2 + det._4_4_;
  local_38 = 0;
  ref_node._4_4_ = p_norm;
  pRStack_20 = ref_grid;
  ref_grid_local = (REF_GRID)metric;
  do {
    if (_node->max <= local_38) {
      if (pRStack_20->twod != 0) {
        for (local_38 = 0; local_38 < _node->max; local_38 = local_38 + 1) {
          if (((-1 < local_38) && (local_38 < _node->max)) && (-1 < _node->global[local_38])) {
            ref_grid_local->cell[(long)(local_38 * 6 + 2) + -2] = (REF_CELL)0x0;
            ref_grid_local->cell[(long)(local_38 * 6 + 4) + -2] = (REF_CELL)0x0;
            ref_grid_local->cell[(long)(local_38 * 6 + 5) + -2] = (REF_CELL)0x3ff0000000000000;
          }
        }
      }
      return 0;
    }
    if (((-1 < local_38) && (local_38 < _node->max)) && (-1 < _node->global[local_38])) {
      uVar2 = ref_matrix_det_m((REF_DBL *)(ref_grid_local->cell + (long)(local_38 * 6) + -2),
                               &exponent);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa2e,"ref_metric_local_scale",(ulong)uVar2,"det_m local hess scale");
        return uVar2;
      }
      if (0.0 < exponent) {
        for (dimension = 0; dimension < 6; dimension = dimension + 1) {
          dVar4 = pow(exponent,-1.0 / (double)iVar1);
          lVar3 = (long)(dimension + local_38 * 6);
          ref_grid_local->cell[lVar3 + -2] =
               (REF_CELL)(dVar4 * (double)ref_grid_local->cell[lVar3 + -2]);
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_local_scale(REF_DBL *metric, REF_GRID ref_grid,
                                          REF_INT p_norm) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_INT dimension;
  REF_DBL det, exponent;

  dimension = 3;
  if (ref_grid_twod(ref_grid)) {
    dimension = 2;
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  /* local scaling */
  exponent = -1.0 / ((REF_DBL)(2 * p_norm + dimension));
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_det_m(&(metric[6 * node]), &det), "det_m local hess scale");
    if (det > 0.0) {
      for (i = 0; i < 6; i++) metric[i + 6 * node] *= pow(det, exponent);
    }
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}